

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void kratos::MergeWireAssignmentsVisitor::extract_sliced_stmts
               (Generator *generator,
               set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               *sliced_stmts)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar1;
  long lVar2;
  undefined1 local_58 [8];
  shared_ptr<kratos::Stmt> stmt;
  shared_ptr<kratos::AssignStmt> assign_stmt;
  
  lVar1 = (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar1 != 0) {
    lVar1 = lVar1 >> 4;
    lVar2 = 0;
    this = &stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    do {
      Generator::get_stmt((Generator *)local_58,(uint32_t)generator);
      if (*(int *)((long)local_58 + 0x78) == 3) {
        Stmt::as<kratos::AssignStmt>((Stmt *)this);
        if ((*(int *)(stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi[0xc]._vptr__Sp_counted_base + 0x2d) == 2) &&
           (*(int *)(*(long *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi[0xc]._M_use_count + 0x168) == 2)) {
          std::
          _Rb_tree<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::_Identity<std::shared_ptr<kratos::AssignStmt>>,std::less<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
          ::_M_emplace_unique<std::shared_ptr<kratos::AssignStmt>&>
                    ((_Rb_tree<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::_Identity<std::shared_ptr<kratos::AssignStmt>>,std::less<std::shared_ptr<kratos::AssignStmt>>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                      *)sliced_stmts,(shared_ptr<kratos::AssignStmt> *)this);
        }
        if (assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     assign_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
      if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 + (ulong)(lVar1 == 0) != lVar2);
  }
  return;
}

Assistant:

static void extract_sliced_stmts(Generator* generator,
                                     std::set<std::shared_ptr<AssignStmt>>& sliced_stmts) {
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Assign) {
                auto assign_stmt = stmt->as<AssignStmt>();
                if (assign_stmt->left()->type() == VarType::Slice &&
                    assign_stmt->right()->type() == VarType::Slice) {
                    sliced_stmts.emplace(assign_stmt);
                }
            }
        }
    }